

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * load_jpeg_image(stbi__jpeg *z,int *out_x,int *out_y,int *comp,int req_comp)

{
  undefined1 uVar1;
  resample_row_func p_Var2;
  resample_row_func *pp_Var3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int *piVar10;
  stbi_uc *psVar11;
  long lVar12;
  bool bVar13;
  resample_row_func local_1a0;
  int local_174;
  stbi_uc *y_1;
  stbi_uc b;
  stbi_uc g;
  stbi_uc r_2;
  stbi_uc m_2;
  stbi_uc m_1;
  stbi_uc m;
  stbi_uc *y;
  int y_bot;
  stbi__resample *r_1;
  stbi_uc *out;
  stbi__resample *r;
  stbi__resample res_comp [4];
  stbi_uc *coutput [4];
  stbi_uc *output;
  uint local_48;
  uint j;
  uint i;
  int k;
  int is_rgb;
  int decode_n;
  int n;
  int req_comp_local;
  int *comp_local;
  int *out_y_local;
  int *out_x_local;
  stbi__jpeg *z_local;
  
  z->s->img_n = 0;
  if ((req_comp < 0) || (4 < req_comp)) {
    stbi__err("bad req_comp");
    z_local = (stbi__jpeg *)0x0;
  }
  else {
    iVar9 = stbi__decode_jpeg_image(z);
    if (iVar9 == 0) {
      stbi__cleanup_jpeg(z);
      z_local = (stbi__jpeg *)0x0;
    }
    else {
      local_174 = req_comp;
      if ((req_comp == 0) && (local_174 = 1, 2 < z->s->img_n)) {
        local_174 = 3;
      }
      bVar13 = false;
      if (((z->s->img_n == 3) && (bVar13 = true, z->rgb != 3)) &&
         (bVar13 = false, z->app14_color_transform == 0)) {
        bVar13 = z->jfif == 0;
      }
      if (((z->s->img_n != 3) || (2 < local_174)) || (bVar13)) {
        k = z->s->img_n;
      }
      else {
        k = 1;
      }
      for (j = 0; (int)j < k; j = j + 1) {
        lVar12 = (long)(int)j;
        piVar10 = &res_comp[lVar12 + -1].ypos;
        psVar11 = (stbi_uc *)stbi__malloc((ulong)(z->s->img_x + 3));
        z->img_comp[(int)j].linebuf = psVar11;
        if (z->img_comp[(int)j].linebuf == (stbi_uc *)0x0) {
          stbi__cleanup_jpeg(z);
          stbi__err("outofmem");
          return (stbi_uc *)0x0;
        }
        *(int *)&res_comp[lVar12].line1 = z->img_h_max / z->img_comp[(int)j].h;
        *(int *)((long)&res_comp[lVar12].line1 + 4) = z->img_v_max / z->img_comp[(int)j].v;
        res_comp[lVar12].vs = *(int *)((long)&res_comp[lVar12].line1 + 4) >> 1;
        res_comp[lVar12].hs =
             ((z->s->img_x + *(int *)&res_comp[lVar12].line1) - 1) /
             *(uint *)&res_comp[lVar12].line1;
        res_comp[lVar12].w_lores = 0;
        p_Var2 = (resample_row_func)z->img_comp[(int)j].data;
        res_comp[lVar12].line0 = (stbi_uc *)p_Var2;
        res_comp[lVar12].resample = p_Var2;
        if ((*(int *)&res_comp[lVar12].line1 == 1) &&
           (*(int *)((long)&res_comp[lVar12].line1 + 4) == 1)) {
          *(code **)piVar10 = resample_row_1;
        }
        else if ((*(int *)&res_comp[lVar12].line1 == 1) &&
                (*(int *)((long)&res_comp[lVar12].line1 + 4) == 2)) {
          *(code **)piVar10 = stbi__resample_row_v_2;
        }
        else if ((*(int *)&res_comp[lVar12].line1 == 2) &&
                (*(int *)((long)&res_comp[lVar12].line1 + 4) == 1)) {
          *(code **)piVar10 = stbi__resample_row_h_2;
        }
        else if ((*(int *)&res_comp[lVar12].line1 == 2) &&
                (*(int *)((long)&res_comp[lVar12].line1 + 4) == 2)) {
          *(_func_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int **)piVar10 =
               z->resample_row_hv_2_kernel;
        }
        else {
          *(code **)piVar10 = stbi__resample_row_generic;
        }
      }
      z_local = (stbi__jpeg *)stbi__malloc_mad3(local_174,z->s->img_x,z->s->img_y,1);
      if (z_local == (stbi__jpeg *)0x0) {
        stbi__cleanup_jpeg(z);
        stbi__err("outofmem");
        z_local = (stbi__jpeg *)0x0;
      }
      else {
        for (output._4_4_ = 0; output._4_4_ < z->s->img_y; output._4_4_ = output._4_4_ + 1) {
          r_1 = (stbi__resample *)
                (z_local->huff_dc[0].fast + ((ulong)(local_174 * z->s->img_x * output._4_4_) - 8));
          for (j = 0; (int)j < k; j = j + 1) {
            lVar12 = (long)(int)j;
            if (res_comp[lVar12].vs < *(int *)((long)&res_comp[lVar12].line1 + 4) >> 1) {
              p_Var2 = res_comp[lVar12].resample;
              local_1a0 = (resample_row_func)res_comp[lVar12].line0;
            }
            else {
              p_Var2 = (resample_row_func)res_comp[lVar12].line0;
              local_1a0 = res_comp[lVar12].resample;
            }
            psVar11 = (stbi_uc *)
                      (**(code **)&res_comp[lVar12 + -1].ypos)
                                (z->img_comp[(int)j].linebuf,p_Var2,local_1a0,res_comp[lVar12].hs,
                                 *(undefined4 *)&res_comp[lVar12].line1);
            coutput[(long)(int)j + -1] = psVar11;
            iVar9 = res_comp[lVar12].vs + 1;
            res_comp[lVar12].vs = iVar9;
            if (*(int *)((long)&res_comp[lVar12].line1 + 4) <= iVar9) {
              res_comp[lVar12].vs = 0;
              res_comp[lVar12].resample = (resample_row_func)res_comp[lVar12].line0;
              iVar9 = res_comp[lVar12].w_lores + 1;
              res_comp[lVar12].w_lores = iVar9;
              if (iVar9 < z->img_comp[(int)j].y) {
                res_comp[lVar12].line0 = res_comp[lVar12].line0 + z->img_comp[(int)j].w2;
              }
            }
          }
          if (local_174 < 3) {
            if (bVar13) {
              if (local_174 == 1) {
                for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                  sVar5 = stbi__compute_y((uint)*(byte *)(res_comp[3]._40_8_ + (ulong)local_48),
                                          (uint)coutput[0][local_48],(uint)coutput[1][local_48]);
                  *(stbi_uc *)&r_1->resample = sVar5;
                  r_1 = (stbi__resample *)((long)&r_1->resample + 1);
                }
              }
              else {
                for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                  sVar5 = stbi__compute_y((uint)*(byte *)(res_comp[3]._40_8_ + (ulong)local_48),
                                          (uint)coutput[0][local_48],(uint)coutput[1][local_48]);
                  *(stbi_uc *)&r_1->resample = sVar5;
                  *(undefined1 *)((long)&r_1->resample + 1) = 0xff;
                  r_1 = (stbi__resample *)((long)&r_1->resample + 2);
                }
              }
            }
            else if ((z->s->img_n == 4) && (z->app14_color_transform == 0)) {
              for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                sVar5 = coutput[2][local_48];
                bVar6 = stbi__blinn_8x8(*(stbi_uc *)(res_comp[3]._40_8_ + (ulong)local_48),sVar5);
                bVar7 = stbi__blinn_8x8(coutput[0][local_48],sVar5);
                bVar8 = stbi__blinn_8x8(coutput[1][local_48],sVar5);
                sVar5 = stbi__compute_y((uint)bVar6,(uint)bVar7,(uint)bVar8);
                *(stbi_uc *)&r_1->resample = sVar5;
                *(undefined1 *)((long)&r_1->resample + 1) = 0xff;
                r_1 = (stbi__resample *)((long)&r_1->resample + (long)local_174);
              }
            }
            else if ((z->s->img_n == 4) && (z->app14_color_transform == 2)) {
              for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                sVar5 = stbi__blinn_8x8(0xff - *(char *)(res_comp[3]._40_8_ + (ulong)local_48),
                                        coutput[2][local_48]);
                *(stbi_uc *)&r_1->resample = sVar5;
                *(undefined1 *)((long)&r_1->resample + 1) = 0xff;
                r_1 = (stbi__resample *)((long)&r_1->resample + (long)local_174);
              }
            }
            else if (local_174 == 1) {
              for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                *(stbi_uc *)((long)&r_1->resample + (ulong)local_48) =
                     *(stbi_uc *)(res_comp[3]._40_8_ + (ulong)local_48);
              }
            }
            else {
              for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                pp_Var3 = &r_1->resample;
                *(undefined1 *)&r_1->resample =
                     *(undefined1 *)(res_comp[3]._40_8_ + (ulong)local_48);
                r_1 = (stbi__resample *)((long)&r_1->resample + 2);
                *(undefined1 *)((long)pp_Var3 + 1) = 0xff;
              }
            }
          }
          else if (z->s->img_n == 3) {
            if (bVar13) {
              for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                *(undefined1 *)&r_1->resample =
                     *(undefined1 *)(res_comp[3]._40_8_ + (ulong)local_48);
                *(stbi_uc *)((long)&r_1->resample + 1) = coutput[0][local_48];
                *(stbi_uc *)((long)&r_1->resample + 2) = coutput[1][local_48];
                *(undefined1 *)((long)&r_1->resample + 3) = 0xff;
                r_1 = (stbi__resample *)((long)&r_1->resample + (long)local_174);
              }
            }
            else {
              (*z->YCbCr_to_RGB_kernel)
                        ((stbi_uc *)r_1,(stbi_uc *)res_comp[3]._40_8_,coutput[0],coutput[1],
                         z->s->img_x,local_174);
            }
          }
          else if (z->s->img_n == 4) {
            if (z->app14_color_transform == 0) {
              for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                sVar5 = coutput[2][local_48];
                sVar4 = stbi__blinn_8x8(*(stbi_uc *)(res_comp[3]._40_8_ + (ulong)local_48),sVar5);
                *(stbi_uc *)&r_1->resample = sVar4;
                sVar4 = stbi__blinn_8x8(coutput[0][local_48],sVar5);
                *(stbi_uc *)((long)&r_1->resample + 1) = sVar4;
                sVar5 = stbi__blinn_8x8(coutput[1][local_48],sVar5);
                *(stbi_uc *)((long)&r_1->resample + 2) = sVar5;
                *(undefined1 *)((long)&r_1->resample + 3) = 0xff;
                r_1 = (stbi__resample *)((long)&r_1->resample + (long)local_174);
              }
            }
            else if (z->app14_color_transform == 2) {
              (*z->YCbCr_to_RGB_kernel)
                        ((stbi_uc *)r_1,(stbi_uc *)res_comp[3]._40_8_,coutput[0],coutput[1],
                         z->s->img_x,local_174);
              for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
                sVar5 = coutput[2][local_48];
                sVar4 = stbi__blinn_8x8(0xff - *(char *)&r_1->resample,sVar5);
                *(stbi_uc *)&r_1->resample = sVar4;
                sVar4 = stbi__blinn_8x8(0xff - *(char *)((long)&r_1->resample + 1),sVar5);
                *(stbi_uc *)((long)&r_1->resample + 1) = sVar4;
                sVar5 = stbi__blinn_8x8(0xff - *(char *)((long)&r_1->resample + 2),sVar5);
                *(stbi_uc *)((long)&r_1->resample + 2) = sVar5;
                r_1 = (stbi__resample *)((long)&r_1->resample + (long)local_174);
              }
            }
            else {
              (*z->YCbCr_to_RGB_kernel)
                        ((stbi_uc *)r_1,(stbi_uc *)res_comp[3]._40_8_,coutput[0],coutput[1],
                         z->s->img_x,local_174);
            }
          }
          else {
            for (local_48 = 0; local_48 < z->s->img_x; local_48 = local_48 + 1) {
              uVar1 = *(undefined1 *)(res_comp[3]._40_8_ + (ulong)local_48);
              *(undefined1 *)((long)&r_1->resample + 2) = uVar1;
              *(undefined1 *)((long)&r_1->resample + 1) = uVar1;
              *(undefined1 *)&r_1->resample = uVar1;
              *(undefined1 *)((long)&r_1->resample + 3) = 0xff;
              r_1 = (stbi__resample *)((long)&r_1->resample + (long)local_174);
            }
          }
        }
        stbi__cleanup_jpeg(z);
        *out_x = z->s->img_x;
        *out_y = z->s->img_y;
        if (comp != (int *)0x0) {
          iVar9 = 1;
          if (2 < z->s->img_n) {
            iVar9 = 3;
          }
          *comp = iVar9;
        }
      }
    }
  }
  return (stbi_uc *)z_local;
}

Assistant:

static stbi_uc *load_jpeg_image(stbi__jpeg *z, int *out_x, int *out_y, int *comp, int req_comp)
{
   int n, decode_n, is_rgb;
   z->s->img_n = 0; // make stbi__cleanup_jpeg safe

   // validate req_comp
   if (req_comp < 0 || req_comp > 4) return stbi__errpuc("bad req_comp", "Internal error");

   // load a jpeg image from whichever source, but leave in YCbCr format
   if (!stbi__decode_jpeg_image(z)) { stbi__cleanup_jpeg(z); return NULL; }

   // determine actual number of components to generate
   n = req_comp ? req_comp : z->s->img_n >= 3 ? 3 : 1;

   is_rgb = z->s->img_n == 3 && (z->rgb == 3 || (z->app14_color_transform == 0 && !z->jfif));

   if (z->s->img_n == 3 && n < 3 && !is_rgb)
      decode_n = 1;
   else
      decode_n = z->s->img_n;

   // resample and color-convert
   {
      int k;
      unsigned int i,j;
      stbi_uc *output;
      stbi_uc *coutput[4];

      stbi__resample res_comp[4];

      for (k=0; k < decode_n; ++k) {
         stbi__resample *r = &res_comp[k];

         // allocate line buffer big enough for upsampling off the edges
         // with upsample factor of 4
         z->img_comp[k].linebuf = (stbi_uc *) stbi__malloc(z->s->img_x + 3);
         if (!z->img_comp[k].linebuf) { stbi__cleanup_jpeg(z); return stbi__errpuc("outofmem", "Out of memory"); }

         r->hs      = z->img_h_max / z->img_comp[k].h;
         r->vs      = z->img_v_max / z->img_comp[k].v;
         r->ystep   = r->vs >> 1;
         r->w_lores = (z->s->img_x + r->hs-1) / r->hs;
         r->ypos    = 0;
         r->line0   = r->line1 = z->img_comp[k].data;

         if      (r->hs == 1 && r->vs == 1) r->resample = resample_row_1;
         else if (r->hs == 1 && r->vs == 2) r->resample = stbi__resample_row_v_2;
         else if (r->hs == 2 && r->vs == 1) r->resample = stbi__resample_row_h_2;
         else if (r->hs == 2 && r->vs == 2) r->resample = z->resample_row_hv_2_kernel;
         else                               r->resample = stbi__resample_row_generic;
      }

      // can't error after this so, this is safe
      output = (stbi_uc *) stbi__malloc_mad3(n, z->s->img_x, z->s->img_y, 1);
      if (!output) { stbi__cleanup_jpeg(z); return stbi__errpuc("outofmem", "Out of memory"); }

      // now go ahead and resample
      for (j=0; j < z->s->img_y; ++j) {
         stbi_uc *out = output + n * z->s->img_x * j;
         for (k=0; k < decode_n; ++k) {
            stbi__resample *r = &res_comp[k];
            int y_bot = r->ystep >= (r->vs >> 1);
            coutput[k] = r->resample(z->img_comp[k].linebuf,
                                     y_bot ? r->line1 : r->line0,
                                     y_bot ? r->line0 : r->line1,
                                     r->w_lores, r->hs);
            if (++r->ystep >= r->vs) {
               r->ystep = 0;
               r->line0 = r->line1;
               if (++r->ypos < z->img_comp[k].y)
                  r->line1 += z->img_comp[k].w2;
            }
         }
         if (n >= 3) {
            stbi_uc *y = coutput[0];
            if (z->s->img_n == 3) {
               if (is_rgb) {
                  for (i=0; i < z->s->img_x; ++i) {
                     out[0] = y[i];
                     out[1] = coutput[1][i];
                     out[2] = coutput[2][i];
                     out[3] = 255;
                     out += n;
                  }
               } else {
                  z->YCbCr_to_RGB_kernel(out, y, coutput[1], coutput[2], z->s->img_x, n);
               }
            } else if (z->s->img_n == 4) {
               if (z->app14_color_transform == 0) { // CMYK
                  for (i=0; i < z->s->img_x; ++i) {
                     stbi_uc m = coutput[3][i];
                     out[0] = stbi__blinn_8x8(coutput[0][i], m);
                     out[1] = stbi__blinn_8x8(coutput[1][i], m);
                     out[2] = stbi__blinn_8x8(coutput[2][i], m);
                     out[3] = 255;
                     out += n;
                  }
               } else if (z->app14_color_transform == 2) { // YCCK
                  z->YCbCr_to_RGB_kernel(out, y, coutput[1], coutput[2], z->s->img_x, n);
                  for (i=0; i < z->s->img_x; ++i) {
                     stbi_uc m = coutput[3][i];
                     out[0] = stbi__blinn_8x8(255 - out[0], m);
                     out[1] = stbi__blinn_8x8(255 - out[1], m);
                     out[2] = stbi__blinn_8x8(255 - out[2], m);
                     out += n;
                  }
               } else { // YCbCr + alpha?  Ignore the fourth channel for now
                  z->YCbCr_to_RGB_kernel(out, y, coutput[1], coutput[2], z->s->img_x, n);
               }
            } else
               for (i=0; i < z->s->img_x; ++i) {
                  out[0] = out[1] = out[2] = y[i];
                  out[3] = 255; // not used if n==3
                  out += n;
               }
         } else {
            if (is_rgb) {
               if (n == 1)
                  for (i=0; i < z->s->img_x; ++i)
                     *out++ = stbi__compute_y(coutput[0][i], coutput[1][i], coutput[2][i]);
               else {
                  for (i=0; i < z->s->img_x; ++i, out += 2) {
                     out[0] = stbi__compute_y(coutput[0][i], coutput[1][i], coutput[2][i]);
                     out[1] = 255;
                  }
               }
            } else if (z->s->img_n == 4 && z->app14_color_transform == 0) {
               for (i=0; i < z->s->img_x; ++i) {
                  stbi_uc m = coutput[3][i];
                  stbi_uc r = stbi__blinn_8x8(coutput[0][i], m);
                  stbi_uc g = stbi__blinn_8x8(coutput[1][i], m);
                  stbi_uc b = stbi__blinn_8x8(coutput[2][i], m);
                  out[0] = stbi__compute_y(r, g, b);
                  out[1] = 255;
                  out += n;
               }
            } else if (z->s->img_n == 4 && z->app14_color_transform == 2) {
               for (i=0; i < z->s->img_x; ++i) {
                  out[0] = stbi__blinn_8x8(255 - coutput[0][i], coutput[3][i]);
                  out[1] = 255;
                  out += n;
               }
            } else {
               stbi_uc *y = coutput[0];
               if (n == 1)
                  for (i=0; i < z->s->img_x; ++i) out[i] = y[i];
               else
                  for (i=0; i < z->s->img_x; ++i) *out++ = y[i], *out++ = 255;
            }
         }
      }
      stbi__cleanup_jpeg(z);
      *out_x = z->s->img_x;
      *out_y = z->s->img_y;
      if (comp) *comp = z->s->img_n >= 3 ? 3 : 1; // report original components, not output
      return output;
   }
}